

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall BinHash<IPAsKeyLRU>::Resize(BinHash<IPAsKeyLRU> *this,uint newSize)

{
  ulong uVar1;
  bool local_41;
  IPAsKeyLRU *pIStack_40;
  bool stored;
  IPAsKeyLRU *x;
  IPAsKeyLRU **ppIStack_30;
  uint i;
  IPAsKeyLRU **newBins;
  IPAsKeyLRU **ppIStack_20;
  uint32_t oldSize;
  IPAsKeyLRU **oldBins;
  BinHash<IPAsKeyLRU> *pBStack_10;
  uint newSize_local;
  BinHash<IPAsKeyLRU> *this_local;
  
  ppIStack_20 = this->hashBin;
  newBins._4_4_ = this->tableSize;
  if (newBins._4_4_ < newSize) {
    uVar1 = SUB168(ZEXT416(newSize) * ZEXT816(8),0);
    if (SUB168(ZEXT416(newSize) * ZEXT816(8),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    oldBins._4_4_ = newSize;
    pBStack_10 = this;
    ppIStack_30 = (IPAsKeyLRU **)operator_new__(uVar1);
    if (ppIStack_30 != (IPAsKeyLRU **)0x0) {
      this->hashBin = ppIStack_30;
      this->tableSize = oldBins._4_4_;
      memset(this->hashBin,0,(ulong)this->tableSize << 3);
      this->tableCount = 0;
      if (ppIStack_20 != (IPAsKeyLRU **)0x0) {
        for (x._4_4_ = 0; x._4_4_ < newBins._4_4_; x._4_4_ = x._4_4_ + 1) {
          while (ppIStack_20[x._4_4_] != (IPAsKeyLRU *)0x0) {
            pIStack_40 = ppIStack_20[x._4_4_];
            local_41 = false;
            ppIStack_20[x._4_4_] = pIStack_40->HashNext;
            DoInsert(this,pIStack_40,false,&local_41);
            if (((local_41 & 1U) == 0) && (pIStack_40 != (IPAsKeyLRU *)0x0)) {
              (*(pIStack_40->super_IPAsKey)._vptr_IPAsKey[1])();
            }
          }
        }
        if (ppIStack_20 != (IPAsKeyLRU **)0x0) {
          operator_delete__(ppIStack_20);
        }
      }
    }
  }
  return;
}

Assistant:

void Resize(unsigned newSize)
    {
        KeyObj ** oldBins = hashBin;
        uint32_t oldSize = tableSize;

        if (oldSize < newSize)
        {
            KeyObj ** newBins = new KeyObj*[newSize];

            if (newBins == NULL)
            {
                /* Cannot allocate memory. Table is unchanged. */
            }
            else
            {
                hashBin = newBins;
                tableSize = newSize;
                memset(hashBin, 0, sizeof(KeyObj *)*tableSize);
                tableCount = 0;

                if (oldBins != NULL)
                {
                    for (unsigned int i = 0; i < oldSize; i++)
                    {
                        while (oldBins[i] != NULL)
                        {
                            KeyObj* x = oldBins[i];
                            bool stored = false;

                            oldBins[i] = x->HashNext;
                            DoInsert(x, false, &stored);
                            if (!stored)
                            {
                                /* This only happens if there was a duplicate in the original table */
                                delete x;
                            }
                        }
                    }
                    
                    delete[] oldBins;
                }
            }
        }
    }